

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O3

void __thiscall
HashtableAllTest_EraseDoesNotResize_Test<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_EraseDoesNotResize_Test<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  int *piVar1;
  size_type sVar2;
  iterator iVar3;
  iterator iVar4;
  iterator iVar5;
  nonempty_iterator piVar6;
  undefined8 uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int i;
  iterator *piVar11;
  AssertHelper *pAVar12;
  sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *psVar13;
  pointer piVar14;
  byte bVar15;
  size_type old_count;
  pair<google::sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
  r;
  int local_124;
  sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_120;
  HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *local_d8;
  size_type local_d0;
  AssertHelper local_c8 [9];
  undefined1 local_80 [80];
  
  bVar15 = 0;
  iVar8 = UniqueObjectHelper<int>(1);
  this_00 = &(this->
             super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ).
             super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_.
             super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_;
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(this_00);
  *(bool *)((long)&(this->
                   super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   ).
                   super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.
                   super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4> + 0x2a)
       = true;
  (this->
  super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ).
  super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.
  super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.key_info.delkey = -iVar8;
  iVar8 = 10;
  do {
    iVar9 = UniqueObjectHelper<int>(iVar8);
    local_120.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)CONCAT44(local_120.ht._4_4_,iVar9);
    google::
    sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::resize_delta(this_00,1);
    google::
    sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::insert_noresize((pair<google::sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
                       *)local_80,this_00,(const_reference)&local_120);
    iVar8 = iVar8 + 1;
  } while (iVar8 != 2000);
  local_d8 = &(this->
              super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ).
              super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_;
  local_d0 = *(size_type *)
              ((long)&(this->
                      super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      ).
                      super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      .ht_.
                      super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      .ht_.table.settings + 0x10);
  iVar8 = 10;
  do {
    local_c8[0].data_._0_4_ = 1;
    local_124 = UniqueObjectHelper<int>(iVar8);
    local_124 = -local_124;
    local_120.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)google::
                      sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      ::erase(this_00,&local_124);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)local_80,"1u","this->ht_.erase(this->UniqueKey(i))",(uint *)local_c8,
               (unsigned_long *)&local_120);
    if (local_80[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_120);
      piVar14 = (pointer)0xaf1463;
      if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           *)local_80._8_8_ !=
          (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           *)0x0) {
        piVar14 = *(pointer *)local_80._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x41f,(char *)piVar14);
      testing::internal::AssertHelper::operator=(local_c8,(Message *)&local_120);
      testing::internal::AssertHelper::~AssertHelper(local_c8);
      if (local_120.ht !=
          (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           *)0x0) {
        (**(code **)(*(long *)&((local_120.ht)->settings).
                               super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
                               super_Hasher + 8))();
      }
    }
    uVar7 = local_80._8_8_;
    if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        local_80._8_8_ !=
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        0x0) {
      if ((int **)*(pointer *)local_80._8_8_ !=
          &(((Settings *)(local_80._8_8_ + 8))->
           super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
           super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
        operator_delete(*(pointer *)local_80._8_8_);
      }
      operator_delete((void *)uVar7);
    }
    iVar8 = iVar8 + 1;
  } while (iVar8 != 1000);
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::begin((iterator *)local_80,this_00);
  local_80._72_8_ = local_d8;
  piVar11 = (iterator *)local_80;
  pAVar12 = local_c8;
  for (lVar10 = 9; lVar10 != 0; lVar10 = lVar10 + -1) {
    pAVar12->data_ = (AssertHelperData *)piVar11->ht;
    piVar11 = (iterator *)((long)piVar11 + (ulong)bVar15 * -0x10 + 8);
    pAVar12 = pAVar12 + (ulong)bVar15 * -2 + 1;
  }
  local_120.pos.row_begin._M_current =
       ((_Vector_impl_data *)
       ((long)&(this->
               super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ).
               super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.
               super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.table.groups + 0x10))->_M_start;
  local_120.pos.row_end._M_current =
       *(pointer *)
        ((long)&(this->
                super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ).
                super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.
                super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.table.groups + 0x18);
  local_120.pos.col_current = (int *)0x0;
  local_120.end.col_current = (nonempty_iterator)0x0;
  local_120.ht = this_00;
  local_120.pos.row_current._M_current = local_120.pos.row_end._M_current;
  local_120.end.row_begin._M_current = local_120.pos.row_begin._M_current;
  local_120.end.row_end._M_current = local_120.pos.row_end._M_current;
  local_120.end.row_current._M_current = local_120.pos.row_end._M_current;
  google::
  sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_deleted(&local_120);
  piVar6 = local_120.pos.col_current;
  iVar5._M_current = local_120.pos.row_current._M_current;
  iVar4._M_current = local_120.pos.row_end._M_current;
  iVar3._M_current = local_120.pos.row_begin._M_current;
  pAVar12 = local_c8;
  psVar13 = &local_120;
  for (lVar10 = 9; lVar10 != 0; lVar10 = lVar10 + -1) {
    psVar13->ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                   *)pAVar12->data_;
    pAVar12 = pAVar12 + (ulong)bVar15 * -2 + 1;
    psVar13 = (sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)((long)psVar13 + ((ulong)bVar15 * -2 + 1) * 8);
  }
  if ((((local_120.pos.row_begin._M_current != iVar3._M_current) ||
       (local_120.pos.row_end._M_current != iVar4._M_current)) ||
      (local_120.pos.row_current._M_current != iVar5._M_current)) ||
     (iVar5._M_current != iVar4._M_current && local_120.pos.col_current != piVar6)) {
    do {
      sVar2 = (this->
              super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ).
              super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.
              super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.num_deleted;
      if (sVar2 == 0) {
        *local_120.pos.col_current =
             -(this->
              super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ).
              super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.
              super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.key_info.delkey;
LAB_0092133b:
        (this->
        super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
        ).
        super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
        .ht_.
        super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
        .ht_.num_deleted = sVar2 + 1;
      }
      else {
        iVar8 = (this->
                super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ).
                super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.
                super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.key_info.delkey;
        iVar9 = *local_120.pos.col_current;
        piVar1 = (int *)((long)&(this->
                                super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                ).
                                super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                .ht_.
                                super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                .ht_.key_info.super_Hasher + 8);
        *piVar1 = *piVar1 + 1;
        *local_120.pos.col_current = -iVar8;
        if (iVar9 + iVar8 != 0) goto LAB_0092133b;
      }
      google::
      sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
      ::operator++(&local_120);
    } while (((local_120.pos.row_begin._M_current != iVar3._M_current) ||
             (local_120.pos.row_end._M_current != iVar4._M_current)) ||
            ((local_120.pos.row_current._M_current != iVar5._M_current ||
             (iVar5._M_current != iVar4._M_current && local_120.pos.col_current != piVar6))));
  }
  *(bool *)((long)&(this->
                   super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   ).
                   super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.
                   super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4> + 0x28)
       = true;
  local_c8[0].data_._0_4_ = 0;
  local_120.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)(*(size_type *)
                      ((long)&(this->
                              super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              ).
                              super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              .ht_.
                              super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              .ht_.table.settings + 0x18) -
                    (this->
                    super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    ).
                    super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    .ht_.
                    super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    .ht_.num_deleted);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_80,"0u","this->ht_.size()",(uint *)local_c8,
             (unsigned_long *)&local_120);
  if (local_80[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_120);
    if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        local_80._8_8_ ==
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        0x0) {
      piVar14 = (pointer)0xaf1463;
    }
    else {
      piVar14 = *(pointer *)local_80._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x422,(char *)piVar14);
    testing::internal::AssertHelper::operator=(local_c8,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper(local_c8);
    if (local_120.ht !=
        (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_120.ht)->settings).
                             super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher
                  + 8))();
    }
  }
  uVar7 = local_80._8_8_;
  if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      local_80._8_8_ !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)*(pointer *)local_80._8_8_ !=
        &(((Settings *)(local_80._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_80._8_8_);
    }
    operator_delete((void *)uVar7);
  }
  local_120.ht = *(sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                   **)((long)&(this->
                              super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              ).
                              super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              .ht_.
                              super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              .ht_.table.settings + 0x10);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_80,"old_count","this->ht_.bucket_count()",&local_d0,
             (unsigned_long *)&local_120);
  if (local_80[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_120);
    if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        local_80._8_8_ ==
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        0x0) {
      piVar14 = (pointer)0xaf1463;
    }
    else {
      piVar14 = *(pointer *)local_80._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x423,(char *)piVar14);
    testing::internal::AssertHelper::operator=(local_c8,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper(local_c8);
    if (local_120.ht !=
        (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_120.ht)->settings).
                             super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher
                  + 8))();
    }
  }
  if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      local_80._8_8_ !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)*(pointer *)local_80._8_8_ !=
        &(((Settings *)(local_80._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_80._8_8_);
    }
    operator_delete((void *)local_80._8_8_);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, EraseDoesNotResize) {
  this->ht_.set_deleted_key(this->UniqueKey(1));
  for (int i = 10; i < 2000; i++) {
    this->ht_.insert(this->UniqueObject(i));
  }
  const typename TypeParam::size_type old_count = this->ht_.bucket_count();
  for (int i = 10; i < 1000; i++) {  // erase half one at a time
    EXPECT_EQ(1u, this->ht_.erase(this->UniqueKey(i)));
  }
  this->ht_.erase(this->ht_.begin(), this->ht_.end());  // and the rest at once
  EXPECT_EQ(0u, this->ht_.size());
  EXPECT_EQ(old_count, this->ht_.bucket_count());
}